

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

field_type __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
::max_count(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
            *this)

{
  template_ElementType<1UL> *ptVar1;
  field_type local_12;
  field_type max_cnt;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
  *this_local;
  
  ptVar1 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>
           ::GetField<1ul>((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>
                            *)this);
  local_12 = ptVar1[3];
  if (local_12 == '\0') {
    local_12 = '\x1e';
  }
  return local_12;
}

Assistant:

field_type max_count() const {
            // Internal nodes have max_count==kInternalNodeMaxCount.
            // Leaf nodes have max_count in [1, kNodeValues].
            const field_type max_cnt = GetField<1>()[3];
            return max_cnt == field_type{kInternalNodeMaxCount}
            ? field_type{kNodeValues}
            : max_cnt;
        }